

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

bool __thiscall QDockAreaLayoutInfo::updateTabBar(QDockAreaLayoutInfo *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  QTabBar *pQVar4;
  quintptr qVar5;
  QDockWidgetGroupWindow *this_00;
  qsizetype qVar6;
  const_reference pQVar7;
  QDockAreaLayoutInfo *pQVar8;
  QDockAreaLayoutInfo *pQVar9;
  quintptr qVar10;
  QDockWidgetGroupWindow *pQVar11;
  uint uVar12;
  long in_RDI;
  long in_FS_OFFSET;
  QDockWidgetGroupWindow *dwgw;
  quintptr id;
  QDockWidget *dw;
  QDockAreaLayoutItem *item;
  int i;
  int tab_idx;
  quintptr oldCurrentId;
  bool gap;
  QDockAreaLayoutInfo *that;
  QString title;
  QSignalBlocker blocker;
  undefined4 in_stack_fffffffffffffe88;
  Shape in_stack_fffffffffffffe8c;
  undefined4 in_stack_fffffffffffffe90;
  uint in_stack_fffffffffffffe94;
  QDockAreaLayoutItem *in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffea0;
  uint in_stack_fffffffffffffea4;
  int in_stack_fffffffffffffea8;
  uint in_stack_fffffffffffffeac;
  QDockAreaLayoutInfo *in_stack_fffffffffffffeb0;
  QDockAreaLayoutInfo *in_stack_fffffffffffffeb8;
  QMainWindowLayout *in_stack_fffffffffffffec0;
  int local_f8;
  int local_f4;
  uint in_stack_ffffffffffffff1c;
  bool local_c9;
  QVariant local_88;
  QVariant local_68;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(byte *)(in_RDI + 0x58) & 1) == 0) {
    local_c9 = false;
  }
  else {
    if (*(long *)(in_RDI + 0x60) == 0) {
      mainWindowLayout((QDockAreaLayoutInfo *)
                       CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
      pQVar4 = QMainWindowLayout::getTabBar(in_stack_fffffffffffffec0);
      *(QTabBar **)(in_RDI + 0x60) = pQVar4;
      QTabBar::setShape((QTabBar *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                        in_stack_fffffffffffffe8c);
      QTabBar::setDrawBase
                ((QTabBar *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                 SUB81((ulong)in_stack_fffffffffffffe98 >> 0x38,0));
    }
    QSignalBlocker::QSignalBlocker
              ((QSignalBlocker *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
               (QObject *)in_stack_fffffffffffffe98);
    in_stack_ffffffffffffff1c = in_stack_ffffffffffffff1c & 0xffffff;
    qVar5 = currentTabId((QDockAreaLayoutInfo *)
                         CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
    local_f4 = 0;
    local_f8 = 0;
    while( true ) {
      this_00 = (QDockWidgetGroupWindow *)(long)local_f8;
      qVar6 = QList<QDockAreaLayoutItem>::size((QList<QDockAreaLayoutItem> *)(in_RDI + 0x40));
      if (qVar6 <= (long)this_00) break;
      pQVar7 = QList<QDockAreaLayoutItem>::at
                         ((QList<QDockAreaLayoutItem> *)
                          CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                          CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      bVar1 = QDockAreaLayoutItem::skip(in_stack_fffffffffffffe98);
      if (!bVar1) {
        if ((pQVar7->flags & 1) == 0) {
          if (pQVar7->widgetItem != (QLayoutItem *)0x0) {
            (*pQVar7->widgetItem->_vptr_QLayoutItem[0xd])();
            qobject_cast<QDockWidget*>((QObject *)0x573ef2);
            QDockWidget::d_func((QDockWidget *)0x573f2e);
            QString::QString((QString *)
                             CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                             (QString *)
                             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
            pQVar8 = (QDockAreaLayoutInfo *)
                     tabId((QDockAreaLayoutItem *)
                           CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
            iVar2 = QTabBar::count((QTabBar *)
                                   CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
            if (local_f4 == iVar2) {
              QTabBar::insertTab((QTabBar *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,
                                 (QString *)
                                 CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
              QTabBar::setTabToolTip
                        ((QTabBar *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                         (int)((ulong)in_stack_fffffffffffffe98 >> 0x20),
                         (QString *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
              ::QVariant::QVariant(&local_28,(ulonglong)pQVar8);
              QTabBar::setTabData((QTabBar *)
                                  CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                                  (int)((ulong)in_stack_fffffffffffffe98 >> 0x20),
                                  (QVariant *)
                                  CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
              ::QVariant::~QVariant(&local_28);
              uVar12 = in_stack_fffffffffffffeac;
            }
            else {
              QTabBar::tabData((QTabBar *)
                               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                               in_stack_fffffffffffffea4);
              in_stack_fffffffffffffeb8 =
                   (QDockAreaLayoutInfo *)
                   qvariant_cast<unsigned_long_long>
                             ((QVariant *)
                              CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
              in_stack_fffffffffffffeb0 = pQVar8;
              ::QVariant::~QVariant(&local_48);
              uVar12 = in_stack_fffffffffffffeac;
              if (in_stack_fffffffffffffeb8 != in_stack_fffffffffffffeb0) {
                in_stack_fffffffffffffea8 = local_f4 + 1;
                iVar2 = QTabBar::count((QTabBar *)
                                       CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90)
                                      );
                uVar12 = in_stack_fffffffffffffeac & 0xffffff;
                bVar1 = in_stack_fffffffffffffea8 < iVar2;
                if (bVar1) {
                  QTabBar::tabData((QTabBar *)
                                   (CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8) &
                                   0xffffffffffffff),in_stack_fffffffffffffea4);
                  pQVar9 = (QDockAreaLayoutInfo *)
                           qvariant_cast<unsigned_long_long>
                                     ((QVariant *)
                                      CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90))
                  ;
                  uVar12 = CONCAT13(pQVar9 == pQVar8,(int3)uVar12);
                }
                in_stack_fffffffffffffea4 =
                     CONCAT13((char)(uVar12 >> 0x18),(int3)in_stack_fffffffffffffea4);
                if (bVar1) {
                  ::QVariant::~QVariant(&local_68);
                }
                if ((in_stack_fffffffffffffea4 & 0x1000000) == 0) {
                  QTabBar::insertTab((QTabBar *)in_stack_fffffffffffffeb0,uVar12,
                                     (QString *)
                                     CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
                  QTabBar::setTabToolTip
                            ((QTabBar *)
                             CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                             (int)((ulong)in_stack_fffffffffffffe98 >> 0x20),
                             (QString *)
                             CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
                  in_stack_fffffffffffffe98 = *(QDockAreaLayoutItem **)(in_RDI + 0x60);
                  in_stack_fffffffffffffea0 = local_f4;
                  ::QVariant::QVariant(&local_88,(ulonglong)pQVar8);
                  QTabBar::setTabData((QTabBar *)
                                      CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                                      (int)((ulong)in_stack_fffffffffffffe98 >> 0x20),
                                      (QVariant *)
                                      CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90))
                  ;
                  ::QVariant::~QVariant(&local_88);
                }
                else {
                  QTabBar::removeTab((QTabBar *)this_00,in_stack_ffffffffffffff1c);
                }
              }
            }
            QTabBar::tabText((QTabBar *)CONCAT44(uVar12,in_stack_fffffffffffffea8),
                             in_stack_fffffffffffffea4);
            bVar1 = ::operator!=((QString *)
                                 CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                                 (QString *)
                                 CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
            in_stack_fffffffffffffe94 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe94);
            QString::~QString((QString *)0x5741e4);
            in_stack_fffffffffffffeac = uVar12;
            if ((in_stack_fffffffffffffe94 & 0x1000000) != 0) {
              QTabBar::setTabText((QTabBar *)in_stack_fffffffffffffeb0,uVar12,
                                  (QString *)
                                  CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
              QTabBar::setTabToolTip
                        ((QTabBar *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                         (int)((ulong)in_stack_fffffffffffffe98 >> 0x20),
                         (QString *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
              in_stack_fffffffffffffeac = uVar12;
            }
            local_f4 = local_f4 + 1;
            QString::~QString((QString *)0x574246);
          }
        }
        else {
          in_stack_ffffffffffffff1c = CONCAT13(1,(int3)in_stack_ffffffffffffff1c);
        }
      }
      local_f8 = local_f8 + 1;
    }
    while (iVar2 = local_f4,
          iVar3 = QTabBar::count((QTabBar *)CONCAT44(in_stack_fffffffffffffe94,local_f4)),
          iVar2 < iVar3) {
      QTabBar::removeTab((QTabBar *)this_00,in_stack_ffffffffffffff1c);
    }
    if ((qVar5 != 0) &&
       (qVar10 = currentTabId((QDockAreaLayoutInfo *)
                              CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0)),
       qVar10 != qVar5)) {
      setCurrentTabId(in_stack_fffffffffffffeb8,(quintptr)in_stack_fffffffffffffeb0);
    }
    QObject::parent((QObject *)0x5742da);
    pQVar11 = qobject_cast<QDockWidgetGroupWindow*>((QObject *)0x5742e2);
    if (pQVar11 != (QDockWidgetGroupWindow *)0x0) {
      QDockWidgetGroupWindow::adjustFlags(this_00);
    }
    uVar12 = (uint)((in_stack_ffffffffffffff1c & 0x1000000) != 0);
    iVar3 = QTabBar::count((QTabBar *)CONCAT44(in_stack_fffffffffffffe94,iVar2));
    local_c9 = 1 < (int)(uVar12 + iVar3);
    QSignalBlocker::~QSignalBlocker((QSignalBlocker *)CONCAT44(in_stack_fffffffffffffe94,iVar2));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_c9;
  }
  __stack_chk_fail();
}

Assistant:

bool QDockAreaLayoutInfo::updateTabBar() const
{
    if (!tabbed)
        return false;

    QDockAreaLayoutInfo *that = const_cast<QDockAreaLayoutInfo*>(this);

    if (that->tabBar == nullptr) {
        that->tabBar = mainWindowLayout()->getTabBar();
        that->tabBar->setShape(static_cast<QTabBar::Shape>(tabBarShape));
        that->tabBar->setDrawBase(true);
    }

    const QSignalBlocker blocker(tabBar);
    bool gap = false;

    const quintptr oldCurrentId = currentTabId();

    int tab_idx = 0;
    for (int i = 0; i < item_list.size(); ++i) {
        const QDockAreaLayoutItem &item = item_list.at(i);
        if (item.skip())
            continue;
        if (item.flags & QDockAreaLayoutItem::GapItem) {
            gap = true;
            continue;
        }
        if (item.widgetItem == nullptr)
            continue;

        QDockWidget *dw = qobject_cast<QDockWidget*>(item.widgetItem->widget());
        QString title = dw->d_func()->fixedWindowTitle;
        quintptr id = tabId(item);
        if (tab_idx == tabBar->count()) {
            tabBar->insertTab(tab_idx, title);
#if QT_CONFIG(tooltip)
            tabBar->setTabToolTip(tab_idx, title);
#endif
            tabBar->setTabData(tab_idx, id);
        } else if (qvariant_cast<quintptr>(tabBar->tabData(tab_idx)) != id) {
            if (tab_idx + 1 < tabBar->count()
                    && qvariant_cast<quintptr>(tabBar->tabData(tab_idx + 1)) == id)
                tabBar->removeTab(tab_idx);
            else {
                tabBar->insertTab(tab_idx, title);
#if QT_CONFIG(tooltip)
                tabBar->setTabToolTip(tab_idx, title);
#endif
                tabBar->setTabData(tab_idx, id);
            }
        }

        if (title != tabBar->tabText(tab_idx)) {
            tabBar->setTabText(tab_idx, title);
#if QT_CONFIG(tooltip)
            tabBar->setTabToolTip(tab_idx, title);
#endif
        }

        ++tab_idx;
    }

    while (tab_idx < tabBar->count()) {
        tabBar->removeTab(tab_idx);
    }

    if (oldCurrentId > 0 && currentTabId() != oldCurrentId)
        that->setCurrentTabId(oldCurrentId);

    if (QDockWidgetGroupWindow *dwgw = qobject_cast<QDockWidgetGroupWindow *>(tabBar->parent()))
        dwgw->adjustFlags();

    //returns if the tabbar is visible or not
    return ( (gap ? 1 : 0) + tabBar->count()) > 1;
}